

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_generic_section.hpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::
generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::key(generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
      *this,string *k)

{
  not_null<const_pstore::exchange::import_ns::string_mapping_*> args;
  bool bVar1;
  section_content *psVar2;
  error_code eVar3;
  reference local_70;
  not_null<const_pstore::exchange::import_ns::string_mapping_*> local_60;
  reference local_58;
  reference local_48;
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *k_local;
  generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  *this_local;
  error_category *local_10;
  
  local_28 = k;
  k_local = (string *)this;
  bVar1 = std::operator==(k,"data");
  if (bVar1) {
    std::bitset<4UL>::operator[]((bitset<4UL> *)&local_38,(size_t)&this->seen_);
    std::bitset<4UL>::reference::operator=(&local_38,true);
    std::bitset<4UL>::reference::~reference(&local_38);
    eVar3 = rule::push<pstore::exchange::import_ns::string_rule,std::__cxx11::string*>
                      (&this->super_rule,&this->data_);
    local_10 = eVar3._M_cat;
    this_local._0_4_ = eVar3._M_value;
  }
  else {
    bVar1 = std::operator==(local_28,"align");
    if (bVar1) {
      std::bitset<4UL>::operator[]((bitset<4UL> *)&local_48,(size_t)&this->seen_);
      std::bitset<4UL>::reference::operator=(&local_48,true);
      std::bitset<4UL>::reference::~reference(&local_48);
      eVar3 = rule::push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
                        (&this->super_rule,&this->align_);
      local_10 = eVar3._M_cat;
      this_local._0_4_ = eVar3._M_value;
    }
    else {
      bVar1 = std::operator==(local_28,"ifixups");
      if (bVar1) {
        std::bitset<4UL>::operator[]((bitset<4UL> *)&local_58,(size_t)&this->seen_);
        std::bitset<4UL>::reference::operator=(&local_58,true);
        std::bitset<4UL>::reference::~reference(&local_58);
        local_60.ptr_ = (this->names_).ptr_;
        psVar2 = gsl::not_null<pstore::repo::section_content_*>::operator->(&this->content_);
        eVar3 = push_array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::internal_fixup,pstore::repo::internal_fixup>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>*>
                          (&this->super_rule,local_60,&psVar2->ifixups);
        local_10 = eVar3._M_cat;
        this_local._0_4_ = eVar3._M_value;
      }
      else {
        bVar1 = std::operator==(local_28,"xfixups");
        if (bVar1) {
          std::bitset<4UL>::operator[]((bitset<4UL> *)&local_70,(size_t)&this->seen_);
          std::bitset<4UL>::reference::operator=(&local_70,true);
          std::bitset<4UL>::reference::~reference(&local_70);
          args.ptr_ = (this->names_).ptr_;
          psVar2 = gsl::not_null<pstore::repo::section_content_*>::operator->(&this->content_);
          eVar3 = push_array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,pstore::repo::external_fixup>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>*>
                            (&this->super_rule,args,&psVar2->xfixups);
          local_10 = eVar3._M_cat;
          this_local._0_4_ = eVar3._M_value;
        }
        else {
          std::error_code::error_code<pstore::exchange::import_ns::error,void>
                    ((error_code *)&this_local,unrecognized_section_object_key);
        }
      }
    }
  }
  eVar3._4_4_ = 0;
  eVar3._M_value = (uint)this_local;
  eVar3._M_cat = local_10;
  return eVar3;
}

Assistant:

std::error_code generic_section<OutputIterator>::key (std::string const & k) {
                if (k == "data") {
                    seen_[data] = true; // string (ascii85)
                    return this->push<string_rule> (&data_);
                }
                if (k == "align") {
                    seen_[align] = true; // integer
                    return this->push<uint64_rule> (&align_);
                }
                if (k == "ifixups") {
                    seen_[ifixups] = true;
                    return push_array_rule<ifixups_object> (this, names_, &content_->ifixups);
                }
                if (k == "xfixups") {
                    seen_[xfixups] = true;
                    return push_array_rule<xfixups_object> (this, names_, &content_->xfixups);
                }
                return error::unrecognized_section_object_key;
            }